

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx512::OrientedDiscMiMBIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  Scene *pSVar4;
  Geometry *pGVar5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  Scene *scene;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  int local_13c;
  RayQueryContext *local_138;
  float local_12c;
  RTCFilterFunctionNArguments local_128;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  Primitive *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar42 [64];
  
  local_138 = context;
  pSVar4 = context->scene;
  uVar25 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar5 = (pSVar4->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar5->time_range).lower;
  fVar10 = pGVar5->fnumTimeSegments *
           (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar1) /
           ((pGVar5->time_range).upper - fVar1));
  auVar39 = vroundss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),9);
  auVar39 = vminss_avx(auVar39,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar39 = vmaxss_avx(ZEXT816(0) << 0x20,auVar39);
  fVar10 = fVar10 - auVar39._0_4_;
  iVar17 = (int)auVar39._0_4_;
  lVar6 = *(long *)&pGVar5[2].numPrimitives;
  lVar23 = (long)iVar17 * 0x38;
  lVar7 = *(long *)(lVar6 + lVar23);
  lVar22 = *(long *)(lVar6 + 0x10 + lVar23);
  auVar39 = *(undefined1 (*) [16])(lVar7 + lVar22 * uVar25);
  uVar15 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar29 = *(undefined1 (*) [16])(lVar7 + lVar22 * uVar15);
  uVar20 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar28 = *(undefined1 (*) [16])(lVar7 + lVar22 * uVar20);
  uVar21 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar30 = *(undefined1 (*) [16])(lVar7 + lVar22 * uVar21);
  auVar32 = vunpcklps_avx(auVar39,auVar28);
  auVar37 = vunpckhps_avx(auVar39,auVar28);
  auVar39 = vunpcklps_avx(auVar29,auVar30);
  auVar38 = vunpckhps_avx(auVar29,auVar30);
  auVar35 = vunpcklps_avx(auVar32,auVar39);
  auVar32 = vunpckhps_avx(auVar32,auVar39);
  auVar36 = vunpcklps_avx(auVar37,auVar38);
  p_Var8 = pGVar5[2].intersectionFilterN;
  lVar7 = *(long *)(p_Var8 + lVar23);
  lVar22 = *(long *)(p_Var8 + lVar23 + 0x10);
  auVar39 = *(undefined1 (*) [16])(lVar7 + lVar22 * uVar25);
  auVar29 = *(undefined1 (*) [16])(lVar7 + lVar22 * uVar15);
  auVar28 = *(undefined1 (*) [16])(lVar7 + lVar22 * uVar20);
  auVar30 = *(undefined1 (*) [16])(lVar7 + lVar22 * uVar21);
  auVar34 = vunpcklps_avx(auVar39,auVar28);
  auVar39 = vunpckhps_avx(auVar39,auVar28);
  auVar28 = vunpcklps_avx(auVar29,auVar30);
  auVar29 = vunpckhps_avx(auVar29,auVar30);
  auVar43 = vunpcklps_avx(auVar39,auVar29);
  auVar44 = vunpcklps_avx(auVar34,auVar28);
  auVar34 = vunpckhps_avx(auVar34,auVar28);
  lVar22 = (long)(iVar17 + 1) * 0x38;
  lVar7 = *(long *)(lVar6 + lVar22);
  lVar6 = *(long *)(lVar6 + 0x10 + lVar22);
  auVar39 = *(undefined1 (*) [16])(lVar7 + lVar6 * uVar25);
  auVar29 = *(undefined1 (*) [16])(lVar7 + lVar6 * uVar15);
  auVar28 = *(undefined1 (*) [16])(lVar7 + lVar6 * uVar20);
  auVar30 = *(undefined1 (*) [16])(lVar7 + lVar6 * uVar21);
  auVar33 = vunpcklps_avx(auVar39,auVar28);
  auVar40 = vunpckhps_avx(auVar39,auVar28);
  auVar39 = vunpcklps_avx(auVar29,auVar30);
  auVar41 = vunpckhps_avx(auVar29,auVar30);
  auVar47 = vunpcklps_avx(auVar33,auVar39);
  auVar33 = vunpckhps_avx(auVar33,auVar39);
  auVar26 = vunpcklps_avx512vl(auVar40,auVar41);
  lVar6 = *(long *)(p_Var8 + lVar22);
  lVar7 = *(long *)(p_Var8 + lVar22 + 0x10);
  auVar39 = *(undefined1 (*) [16])(lVar6 + uVar25 * lVar7);
  auVar29 = *(undefined1 (*) [16])(lVar6 + uVar15 * lVar7);
  auVar28 = *(undefined1 (*) [16])(lVar6 + uVar20 * lVar7);
  auVar30 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar21);
  auVar27 = vunpcklps_avx512vl(auVar39,auVar28);
  auVar39 = vunpckhps_avx(auVar39,auVar28);
  auVar28 = vunpcklps_avx512vl(auVar29,auVar30);
  auVar29 = vunpckhps_avx512vl(auVar29,auVar30);
  auVar30 = vunpcklps_avx512vl(auVar39,auVar29);
  auVar31 = vunpcklps_avx512vl(auVar27,auVar28);
  auVar27 = vunpckhps_avx512vl(auVar27,auVar28);
  auVar45._4_4_ = fVar10;
  auVar45._0_4_ = fVar10;
  auVar45._8_4_ = fVar10;
  auVar45._12_4_ = fVar10;
  fVar1 = 1.0 - fVar10;
  auVar46._4_4_ = fVar1;
  auVar46._0_4_ = fVar1;
  auVar46._8_4_ = fVar1;
  auVar46._12_4_ = fVar1;
  auVar39._0_4_ = fVar10 * auVar47._0_4_;
  auVar39._4_4_ = fVar10 * auVar47._4_4_;
  auVar39._8_4_ = fVar10 * auVar47._8_4_;
  auVar39._12_4_ = fVar10 * auVar47._12_4_;
  auVar29._0_4_ = fVar10 * auVar33._0_4_;
  auVar29._4_4_ = fVar10 * auVar33._4_4_;
  auVar29._8_4_ = fVar10 * auVar33._8_4_;
  auVar29._12_4_ = fVar10 * auVar33._12_4_;
  auVar28 = vmulps_avx512vl(auVar45,auVar26);
  auVar39 = vfmadd231ps_fma(auVar39,auVar46,auVar35);
  auVar29 = vfmadd231ps_fma(auVar29,auVar46,auVar32);
  auVar28 = vfmadd231ps_fma(auVar28,auVar46,auVar36);
  auVar32 = vmulps_avx512vl(auVar45,auVar31);
  auVar33 = vmulps_avx512vl(auVar45,auVar27);
  auVar30 = vmulps_avx512vl(auVar45,auVar30);
  local_78 = vfmadd231ps_fma(auVar32,auVar46,auVar44);
  local_68 = vfmadd231ps_fma(auVar33,auVar46,auVar34);
  auVar32 = vpbroadcastd_avx512vl();
  uVar13 = vpcmpgtd_avx512vl(auVar32,_DAT_01ff0cf0);
  local_58 = vfmadd231ps_fma(auVar30,auVar46,auVar43);
  local_48 = vpbroadcastd_avx512vl();
  uVar2 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  auVar43._4_4_ = uVar2;
  auVar43._0_4_ = uVar2;
  auVar43._8_4_ = uVar2;
  auVar43._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  auVar44._4_4_ = uVar2;
  auVar44._0_4_ = uVar2;
  auVar44._8_4_ = uVar2;
  auVar44._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  auVar47._4_4_ = uVar2;
  auVar47._0_4_ = uVar2;
  auVar47._8_4_ = uVar2;
  auVar47._12_4_ = uVar2;
  auVar30 = vmulps_avx512vl(local_58,auVar47);
  auVar30 = vfmadd231ps_avx512vl(auVar30,auVar44,local_68);
  auVar30 = vfmadd231ps_avx512vl(auVar30,auVar43,local_78);
  uVar15 = vcmpps_avx512vl(auVar30,ZEXT816(0) << 0x20,0);
  fVar1 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar35._4_4_ = fVar1;
  auVar35._0_4_ = fVar1;
  auVar35._8_4_ = fVar1;
  auVar35._12_4_ = fVar1;
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
  auVar33 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
  auVar32 = vsubps_avx512vl(auVar39,auVar35);
  auVar35 = vsubps_avx512vl(auVar29,auVar34);
  auVar36 = vsubps_avx512vl(auVar28,auVar33);
  auVar36 = vmulps_avx512vl(local_58,auVar36);
  auVar35 = vfmadd231ps_avx512vl(auVar36,local_68,auVar35);
  auVar32 = vfmadd231ps_avx512vl(auVar35,local_78,auVar32);
  auVar30 = vdivps_avx512vl(auVar32,auVar30);
  bVar9 = (bool)((byte)uVar15 & 1);
  local_88._0_4_ = (uint)bVar9 * auVar32._0_4_ | (uint)!bVar9 * auVar30._0_4_;
  bVar9 = (bool)((byte)(uVar15 >> 1) & 1);
  local_88._4_4_ = (uint)bVar9 * auVar32._4_4_ | (uint)!bVar9 * auVar30._4_4_;
  bVar9 = (bool)((byte)(uVar15 >> 2) & 1);
  local_88._8_4_ = (uint)bVar9 * auVar32._8_4_ | (uint)!bVar9 * auVar30._8_4_;
  bVar9 = (bool)((byte)(uVar15 >> 3) & 1);
  local_88._12_4_ = (uint)bVar9 * auVar32._12_4_ | (uint)!bVar9 * auVar30._12_4_;
  auVar48 = ZEXT1664(local_88);
  uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar30._4_4_ = uVar2;
  auVar30._0_4_ = uVar2;
  auVar30._8_4_ = uVar2;
  auVar30._12_4_ = uVar2;
  uVar11 = vcmpps_avx512vl(local_88,auVar30,0xd);
  fVar3 = (ray->super_RayK<1>).tfar;
  auVar32._4_4_ = fVar3;
  auVar32._0_4_ = fVar3;
  auVar32._8_4_ = fVar3;
  auVar32._12_4_ = fVar3;
  uVar12 = vcmpps_avx512vl(local_88,auVar32,2);
  bVar18 = (byte)uVar11 & (byte)uVar12 & ~(byte)uVar15 & (byte)uVar13 & 0xf;
  if (bVar18 != 0) {
    auVar30 = vunpckhps_avx(auVar37,auVar38);
    auVar37 = vunpckhps_avx(auVar40,auVar41);
    auVar38._0_4_ = fVar10 * auVar37._0_4_;
    auVar38._4_4_ = fVar10 * auVar37._4_4_;
    auVar38._8_4_ = fVar10 * auVar37._8_4_;
    auVar38._12_4_ = fVar10 * auVar37._12_4_;
    auVar30 = vfmadd231ps_fma(auVar38,auVar46,auVar30);
    auVar37 = vmulps_avx512vl(auVar43,local_88);
    auVar38 = vmulps_avx512vl(auVar44,local_88);
    auVar32 = vmulps_avx512vl(auVar47,local_88);
    auVar40._0_4_ = fVar1 + auVar37._0_4_;
    auVar40._4_4_ = fVar1 + auVar37._4_4_;
    auVar40._8_4_ = fVar1 + auVar37._8_4_;
    auVar40._12_4_ = fVar1 + auVar37._12_4_;
    auVar37 = vaddps_avx512vl(auVar34,auVar38);
    auVar38 = vaddps_avx512vl(auVar33,auVar32);
    auVar39 = vsubps_avx(auVar40,auVar39);
    auVar29 = vsubps_avx(auVar37,auVar29);
    auVar28 = vsubps_avx(auVar38,auVar28);
    auVar37._0_4_ = auVar28._0_4_ * auVar28._0_4_;
    auVar37._4_4_ = auVar28._4_4_ * auVar28._4_4_;
    auVar37._8_4_ = auVar28._8_4_ * auVar28._8_4_;
    auVar37._12_4_ = auVar28._12_4_ * auVar28._12_4_;
    auVar29 = vfmadd231ps_fma(auVar37,auVar29,auVar29);
    auVar39 = vfmadd231ps_fma(auVar29,auVar39,auVar39);
    auVar28._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar28._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar28._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar28._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    uVar11 = vcmpps_avx512vl(auVar39,auVar28,1);
    bVar18 = bVar18 & (byte)uVar11;
    uVar19 = (uint)bVar18;
    if (bVar18 != 0) {
      local_a8 = ZEXT432(0) << 0x20;
      auVar41._8_4_ = 0x7f800000;
      auVar41._0_8_ = 0x7f8000007f800000;
      auVar41._12_4_ = 0x7f800000;
      auVar42 = ZEXT1664(auVar41);
      auVar39 = vblendmps_avx512vl(auVar41,local_88);
      auVar34._4_4_ = (uint)(bVar18 >> 1 & 1) * auVar39._4_4_;
      auVar34._0_4_ = (uint)(bVar18 & 1) * auVar39._0_4_;
      auVar34._8_4_ = (uint)(bVar18 >> 2 & 1) * auVar39._8_4_;
      auVar34._12_4_ = (uint)(bVar18 >> 3) * auVar39._12_4_;
      auVar39 = vshufps_avx(auVar34,auVar34,0xb1);
      auVar39 = vminps_avx(auVar39,auVar34);
      auVar29 = vshufpd_avx(auVar39,auVar39,1);
      auVar39 = vminps_avx(auVar29,auVar39);
      uVar11 = vcmpps_avx512vl(auVar34,auVar39,0);
      bVar18 = (byte)uVar11 & bVar18;
      uVar16 = uVar19;
      if (bVar18 != 0) {
        uVar16 = (uint)bVar18;
      }
      uVar14 = 0;
      for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x80000000) {
        uVar14 = uVar14 + 1;
      }
      do {
        uVar24 = uVar14 & 0xff;
        uVar16 = *(uint *)(local_48 + (ulong)uVar24 * 4);
        pGVar5 = (pSVar4->geometries).items[uVar16].ptr;
        if ((pGVar5->mask & (ray->super_RayK<1>).mask) == 0) {
          bVar18 = ~(byte)(1 << (uVar14 & 0x1f)) & (byte)uVar19;
LAB_01bd4bcc:
          uVar19 = (uint)bVar18;
          bVar9 = true;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
            uVar15 = (ulong)(uVar24 * 4);
            local_f8 = *(undefined4 *)(local_78 + uVar15);
            local_f4 = *(undefined4 *)(local_68 + uVar15);
            local_f0 = *(undefined4 *)(local_58 + uVar15);
            local_ec = *(undefined4 *)(local_a8 + uVar15);
            local_e8 = *(undefined4 *)(local_a8 + uVar15 + 0x10);
            local_e4 = *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar15);
            local_e0 = uVar16;
            local_dc = context->user->instID[0];
            local_d8 = context->user->instPrimID[0];
            local_12c = (ray->super_RayK<1>).tfar;
            (ray->super_RayK<1>).tfar = *(float *)(local_88 + uVar15);
            local_13c = -1;
            local_128.valid = &local_13c;
            local_128.geometryUserPtr = pGVar5->userPtr;
            local_128.context = context->user;
            local_128.ray = (RTCRayN *)ray;
            local_128.hit = (RTCHitN *)&local_f8;
            local_128.N = 1;
            local_b8 = auVar48._0_16_;
            if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01bd4d3b:
              p_Var8 = context->args->filter;
              if (p_Var8 != (RTCFilterFunctionN)0x0) {
                if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                {
                  (*p_Var8)(&local_128);
                  auVar42 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  auVar48 = ZEXT1664(local_b8);
                  context = local_138;
                }
                if (*local_128.valid == 0) goto LAB_01bd4de9;
              }
              (((Vec3f *)((long)local_128.ray + 0x30))->field_0).field_0.x = *(float *)local_128.hit
              ;
              (((Vec3f *)((long)local_128.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_128.hit + 4);
              (((Vec3f *)((long)local_128.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_128.hit + 8);
              *(float *)((long)local_128.ray + 0x3c) = *(float *)(local_128.hit + 0xc);
              local_12c = *(float *)(local_128.hit + 0x10);
              *(float *)((long)local_128.ray + 0x40) = local_12c;
              *(float *)((long)local_128.ray + 0x44) = *(float *)(local_128.hit + 0x14);
              *(float *)((long)local_128.ray + 0x48) = *(float *)(local_128.hit + 0x18);
              *(float *)((long)local_128.ray + 0x4c) = *(float *)(local_128.hit + 0x1c);
              *(float *)((long)local_128.ray + 0x50) = *(float *)(local_128.hit + 0x20);
            }
            else {
              local_c0 = Disc;
              (*pGVar5->intersectionFilterN)(&local_128);
              auVar42 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar48 = ZEXT1664(local_b8);
              context = local_138;
              Disc = local_c0;
              if (*local_128.valid != 0) goto LAB_01bd4d3b;
LAB_01bd4de9:
              (ray->super_RayK<1>).tfar = local_12c;
            }
            auVar34 = ZEXT416((uint)local_12c);
            fVar1 = (ray->super_RayK<1>).tfar;
            auVar33._4_4_ = fVar1;
            auVar33._0_4_ = fVar1;
            auVar33._8_4_ = fVar1;
            auVar33._12_4_ = fVar1;
            uVar11 = vcmpps_avx512vl(auVar48._0_16_,auVar33,2);
            bVar18 = ~(byte)(1 << (uVar14 & 0x1f)) & (byte)uVar19 & (byte)uVar11;
            goto LAB_01bd4bcc;
          }
          bVar9 = false;
        }
        if (!bVar9) {
          uVar15 = (ulong)(uVar24 << 2);
          fVar1 = *(float *)(local_a8 + uVar15);
          fVar3 = *(float *)(local_a8 + uVar15 + 0x10);
          (ray->super_RayK<1>).tfar = *(float *)(local_88 + uVar15);
          (ray->Ng).field_0.field_0.x = *(float *)(local_78 + uVar15);
          (ray->Ng).field_0.field_0.y = *(float *)(local_68 + uVar15);
          (ray->Ng).field_0.field_0.z = *(float *)(local_58 + uVar15);
          ray->u = fVar1;
          ray->v = fVar3;
          ray->primID = *(uint *)((long)&(Disc->primIDs).field_0 + uVar15);
          ray->geomID = uVar16;
          ray->instID[0] = context->user->instID[0];
          ray->instPrimID[0] = context->user->instPrimID[0];
          return;
        }
        bVar18 = (byte)uVar19;
        if (bVar18 == 0) {
          return;
        }
        auVar39 = vblendmps_avx512vl(auVar42._0_16_,auVar48._0_16_);
        auVar36._0_4_ =
             (uint)(bVar18 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar18 & 1) * auVar34._0_4_;
        bVar9 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar36._4_4_ = (uint)bVar9 * auVar39._4_4_ | (uint)!bVar9 * auVar34._4_4_;
        bVar9 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar36._8_4_ = (uint)bVar9 * auVar39._8_4_ | (uint)!bVar9 * auVar34._8_4_;
        auVar36._12_4_ =
             (uVar19 >> 3) * auVar39._12_4_ | (uint)!SUB41(uVar19 >> 3,0) * auVar34._12_4_;
        auVar39 = vshufps_avx(auVar36,auVar36,0xb1);
        auVar39 = vminps_avx(auVar39,auVar36);
        auVar29 = vshufpd_avx(auVar39,auVar39,1);
        auVar39 = vminps_avx(auVar29,auVar39);
        uVar11 = vcmpps_avx512vl(auVar36,auVar39,0);
        bVar18 = (byte)uVar11 & bVar18;
        uVar16 = uVar19;
        if (bVar18 != 0) {
          uVar16 = (uint)bVar18;
        }
        uVar14 = 0;
        for (; auVar34 = auVar36, (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x80000000) {
          uVar14 = uVar14 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time());
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, n0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }